

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O0

void duckdb::InSearchPathFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  anon_class_16_2_9a274d3c fun;
  ClientContext *left;
  ClientData *pCVar1;
  reference pvVar2;
  Vector *in_RDX;
  DataChunk *in_RDI;
  ExpressionState *in_stack_00000020;
  unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
  *search_path;
  ClientContext *context;
  size_type in_stack_ffffffffffffffa8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffb0;
  Vector *right;
  
  left = ExpressionState::GetContext(in_stack_00000020);
  pCVar1 = ClientData::Get((ClientContext *)0x2007efc);
  right = (Vector *)&pCVar1->catalog_search_path;
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)pvVar2,in_stack_ffffffffffffffa8);
  DataChunk::size(in_RDI);
  fun.context = left;
  fun.search_path =
       (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
        *)right;
  BinaryExecutor::
  Execute<duckdb::string_t,duckdb::string_t,bool,duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
            ((Vector *)left,right,in_RDX,(idx_t)pvVar2,fun);
  return;
}

Assistant:

static void InSearchPathFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &context = state.GetContext();
	auto &search_path = ClientData::Get(context).catalog_search_path;
	BinaryExecutor::Execute<string_t, string_t, bool>(
	    input.data[0], input.data[1], result, input.size(), [&](string_t db_name, string_t schema_name) {
		    return search_path->SchemaInSearchPath(context, db_name.GetString(), schema_name.GetString());
	    });
}